

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O1

void slang::ast::VariableSymbol::fromSyntax
               (Compilation *compilation,DataDeclarationSyntax *syntax,Scope *scope,
               bool isCheckerFreeVar,SmallVectorBase<slang::ast::VariableSymbol_*> *results)

{
  undefined1 *puVar1;
  Token *pTVar2;
  Token *this;
  SymbolKind SVar3;
  size_t sVar4;
  pointer pTVar5;
  Symbol *pSVar6;
  char *pcVar7;
  DeclaratorSyntax *decl;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  undefined2 uVar8;
  char cVar9;
  DataDeclarationSyntax *pDVar10;
  bool bVar11;
  uint uVar12;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar13;
  VariableSymbol *this_00;
  undefined7 in_register_00000009;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  SourceRange SVar17;
  optional<slang::ast::VariableLifetime> lifetime;
  Token mod;
  undefined8 local_78;
  undefined4 local_70;
  undefined4 local_6c;
  Token local_68;
  DataDeclarationSyntax *local_58;
  ulong local_50;
  Compilation *local_48;
  SmallVectorBase<slang::ast::VariableSymbol_*> *local_40;
  SourceLocation local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,isCheckerFreeVar);
  local_48 = compilation;
  local_40 = results;
  bVar11 = Scope::isProceduralContext(scope);
  local_78._0_5_ = (uint5)(VariableLifetime)local_78;
  sVar4 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  local_58 = syntax;
  if (sVar4 == 0) {
    uVar14 = 0;
  }
  else {
    pTVar5 = (syntax->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr;
    lVar16 = 0;
    uVar14 = 0;
    do {
      pTVar2 = (Token *)((long)&pTVar5->kind + lVar16);
      uVar8 = pTVar2->kind;
      local_68 = *pTVar2;
      if ((ushort)uVar8 < StaticKeyword) {
        if (uVar8 == AutomaticKeyword) {
          local_78 = 0x100000000;
          if (!bVar11) {
            SVar17 = parsing::Token::range(&local_68);
            Scope::addDiag(scope,(DiagCode)0x50006,SVar17);
            goto LAB_00258e0e;
          }
        }
        else {
          uVar14 = 1;
        }
      }
      else if (uVar8 == StaticKeyword) {
LAB_00258e0e:
        local_78 = 0x100000001;
      }
      lVar16 = lVar16 + 0x10;
    } while (sVar4 << 4 != lVar16);
  }
  pDVar10 = local_58;
  cVar9 = local_78._4_1_;
  if (local_78._4_1_ == '\0') {
    pSVar6 = scope->thisSym;
    SVar3 = pSVar6->kind;
    if (SVar3 == MethodPrototype) {
      uVar12 = 0;
    }
    else if (SVar3 == Subroutine) {
      uVar12 = *(uint *)&pSVar6[2].originatingSyntax;
    }
    else if (SVar3 == StatementBlock) {
      uVar12 = *(uint *)((long)&pSVar6[1].originatingSyntax + 4);
    }
    else {
      uVar12 = 1;
    }
    local_78 = (ulong)uVar12 | 0x100000000;
  }
  if (scope->thisSym->kind == InstanceBody) {
    pcVar7 = scope->thisSym[2].name._M_str;
    local_70 = (undefined4)CONCAT71((int7)((ulong)pcVar7 >> 8),*(int *)(pcVar7 + 0x48) == 1);
  }
  else {
    local_70 = 0;
  }
  uVar15 = (local_58->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar15) {
    uVar15 = uVar15 >> 1;
    lVar16 = 0;
    local_50 = uVar14;
    do {
      ppSVar13 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            ((long)&(((pDVar10->declarators).elements._M_ptr)->
                                    super_ConstTokenOrSyntax).
                                    super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                    .
                                    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                            + lVar16));
      decl = (DeclaratorSyntax *)*ppSVar13;
      this = &decl->name;
      local_68 = (Token)parsing::Token::valueText(this);
      local_38 = parsing::Token::location(this);
      this_00 = BumpAllocator::
                emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&>
                          (&local_48->super_BumpAllocator,
                           (basic_string_view<char,_std::char_traits<char>_> *)&local_68,&local_38,
                           (VariableLifetime *)&local_78);
      local_68._0_8_ = this_00;
      (this_00->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pDVar10->type).ptr;
      puVar1 = &(this_00->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_00->super_ValueSymbol,decl);
      syntax_00._M_ptr =
           (pDVar10->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (pDVar10->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_68._0_8_,scope,syntax_00);
      SmallVectorBase<slang::ast::VariableSymbol*>::emplace_back<slang::ast::VariableSymbol*const&>
                ((SmallVectorBase<slang::ast::VariableSymbol*> *)local_40,
                 (VariableSymbol **)&local_68);
      uVar14 = local_50;
      if ((local_50 & 1) != 0) {
        *(ushort *)(local_68._0_8_ + 0x154) = *(ushort *)(local_68._0_8_ + 0x154) | 1;
      }
      if ((char)local_6c != '\0') {
        *(ushort *)(local_68._0_8_ + 0x154) = *(ushort *)(local_68._0_8_ + 0x154) | 0x10;
      }
      if ((char)local_70 != '\0') {
        *(uint *)(local_68._0_8_ + 0x78) = *(uint *)(local_68._0_8_ + 0x78) | 0x10000;
      }
      if ((((VariableLifetime)local_78 == Static && cVar9 == '\0') &&
          (decl->initializer != (EqualsValueClauseSyntax *)0x0)) &&
         (bVar11 = Scope::isProceduralContext(scope), bVar11)) {
        SVar17 = parsing::Token::range(this);
        Scope::addDiag(scope,(DiagCode)0xf90006,SVar17);
      }
      if (((uVar14 & 1) != 0) &&
         (decl->initializer == (EqualsValueClauseSyntax *)0x0 && (char)local_6c == '\0')) {
        SVar17 = parsing::Token::range(this);
        Scope::addDiag(scope,(DiagCode)0x1f0006,SVar17);
      }
      lVar16 = lVar16 + 0x30;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  return;
}

Assistant:

void VariableSymbol::fromSyntax(Compilation& compilation, const DataDeclarationSyntax& syntax,
                                const Scope& scope, bool isCheckerFreeVar,
                                SmallVectorBase<VariableSymbol*>& results) {
    bool isConst = false;
    bool inProceduralContext = scope.isProceduralContext();
    std::optional<VariableLifetime> lifetime;
    for (Token mod : syntax.modifiers) {
        switch (mod.kind) {
            case TokenKind::VarKeyword:
                break;
            case TokenKind::ConstKeyword:
                isConst = true;
                break;
            case TokenKind::StaticKeyword:
                // Static lifetimes are allowed in all contexts.
                lifetime = VariableLifetime::Static;
                break;
            case TokenKind::AutomaticKeyword:
                // Automatic lifetimes are only allowed in procedural contexts.
                lifetime = VariableLifetime::Automatic;
                if (!inProceduralContext) {
                    scope.addDiag(diag::AutomaticNotAllowed, mod.range());
                    lifetime = VariableLifetime::Static;
                }
                break;
            default:
                SLANG_UNREACHABLE;
        }
    }

    // If no explicit lifetime is provided, find the default one for this scope.
    bool hasExplicitLifetime = lifetime.has_value();
    if (!hasExplicitLifetime)
        lifetime = getDefaultLifetime(scope);

    const bool isInIface =
        scope.asSymbol().kind == SymbolKind::InstanceBody &&
        scope.asSymbol().as<InstanceBodySymbol>().getDefinition().definitionKind ==
            DefinitionKind::Interface;

    for (auto declarator : syntax.declarators) {
        auto variable = compilation.emplace<VariableSymbol>(declarator->name.valueText(),
                                                            declarator->name.location(), *lifetime);
        variable->setDeclaredType(*syntax.type);
        variable->setFromDeclarator(*declarator);
        variable->setAttributes(scope, syntax.attributes);
        results.push_back(variable);

        if (isConst)
            variable->flags |= VariableFlags::Const;

        if (isCheckerFreeVar)
            variable->flags |= VariableFlags::CheckerFreeVariable;

        if (isInIface)
            variable->getDeclaredType()->addFlags(DeclaredTypeFlags::InterfaceVariable);

        // If this is a static variable in a procedural context and it has an initializer,
        // the spec requires that the static keyword must be explicitly provided.
        if (*lifetime == VariableLifetime::Static && !hasExplicitLifetime &&
            declarator->initializer && scope.isProceduralContext()) {
            scope.addDiag(diag::StaticInitializerMustBeExplicit, declarator->name.range());
        }

        // Constants require an initializer.
        if (isConst && !declarator->initializer && !isCheckerFreeVar)
            scope.addDiag(diag::ConstVarNoInitializer, declarator->name.range());
    }
}